

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addConstructor(QMetaObjectBuilder *this,QMetaMethod *prototype)

{
  int __type;
  QMetaMethod *in_RSI;
  char *__name;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar1;
  QMetaMethodBuilder ctor;
  undefined4 in_stack_fffffffffffffef8;
  Access in_stack_fffffffffffffefc;
  QMetaMethodBuilder *in_stack_ffffffffffffff00;
  QMetaMethod *in_stack_ffffffffffffff08;
  qsizetype in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *data;
  QByteArray *pQVar2;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char local_88 [24];
  char local_70 [24];
  QByteArray local_58;
  QMetaObjectBuilder *local_40;
  int local_38;
  QByteArray local_30;
  QMetaObjectBuilder *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QMetaObjectBuilder *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = &local_30;
  QMetaMethod::methodSignature(in_stack_ffffffffffffff08);
  QVar1 = addConstructor((QMetaObjectBuilder *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),pQVar2);
  local_40 = QVar1._mobj;
  local_38 = QVar1._index;
  puStack_10 = (undefined1 *)CONCAT44(puStack_10._4_4_,local_38);
  local_18 = local_40;
  QByteArray::~QByteArray((QByteArray *)0x3724d3);
  QMetaMethod::typeName
            ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pQVar2 = &local_58;
  QByteArray::QByteArray(pQVar2,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  QMetaMethodBuilder::setReturnType
            (in_stack_ffffffffffffff00,
             (QByteArray *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QByteArray::~QByteArray((QByteArray *)0x37251a);
  data = local_70;
  QMetaMethod::parameterNames(in_stack_ffffffffffffff08);
  QMetaMethodBuilder::setParameterNames
            (in_stack_ffffffffffffff00,
             (QList<QByteArray> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QList<QByteArray>::~QList((QList<QByteArray> *)0x372552);
  QMetaMethod::tag((QMetaMethod *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  __name = local_88;
  QByteArray::QByteArray(pQVar2,data,(qsizetype)__name);
  QMetaMethodBuilder::setTag
            (in_stack_ffffffffffffff00,
             (QByteArray *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QByteArray::~QByteArray((QByteArray *)0x372599);
  QMetaMethod::access(in_RSI,__name,__type);
  QMetaMethodBuilder::setAccess(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  QMetaMethod::attributes
            ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QMetaMethodBuilder::setAttributes(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1._index = puStack_10._0_4_;
    QVar1._mobj = local_18;
    QVar1._12_4_ = 0;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addConstructor(const QMetaMethod &prototype)
{
    Q_ASSERT(prototype.methodType() == QMetaMethod::Constructor);
    QMetaMethodBuilder ctor = addConstructor(prototype.methodSignature());
    ctor.setReturnType(prototype.typeName());
    ctor.setParameterNames(prototype.parameterNames());
    ctor.setTag(prototype.tag());
    ctor.setAccess(prototype.access());
    ctor.setAttributes(prototype.attributes());
    return ctor;
}